

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::reduction_op<ncnn::reduction_op_add<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  int *piVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  void *pvVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  float fVar22;
  Mat mins;
  Mat local_78;
  
  sVar1 = a->elemsize;
  iVar21 = a->dims;
  if (iVar21 == 3) {
    uVar8 = a->w;
    uVar16 = (ulong)uVar8;
    uVar7 = a->h;
    uVar14 = (ulong)uVar7;
    uVar6 = a->c;
    uVar11 = (ulong)uVar6;
    uVar13 = uVar7 * uVar8;
    bVar17 = !reduce_w;
    bVar5 = !reduce_h;
    if ((bVar17 || bVar5) || !reduce_c) {
      if ((!bVar17 && !bVar5) && !reduce_c) {
        Mat::create(b,uVar6,sVar1,opt->blob_allocator);
        if (0 < (int)uVar6) {
          sVar1 = a->cstep;
          sVar2 = a->elemsize;
          pvVar9 = a->data;
          pvVar12 = b->data;
          uVar16 = 0;
          do {
            fVar22 = 0.0;
            if (0 < (int)uVar13) {
              uVar14 = 0;
              do {
                fVar22 = fVar22 + *(float *)((long)pvVar9 + uVar14 * 4);
                uVar14 = uVar14 + 1;
              } while (uVar13 != uVar14);
            }
            *(float *)((long)pvVar12 + uVar16 * 4) = fVar22;
            uVar16 = uVar16 + 1;
            pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar2);
          } while (uVar16 != uVar11);
          return 0;
        }
        return 0;
      }
      lVar10 = (long)(int)uVar8;
      if ((!bVar17 && !reduce_h) && !reduce_c) {
        Mat::create(b,uVar7,uVar6,sVar1,opt->blob_allocator);
        if (0 < (int)uVar6) {
          pvVar9 = a->data;
          sVar1 = a->cstep;
          iVar21 = b->w;
          sVar2 = b->elemsize;
          sVar3 = a->elemsize;
          pvVar12 = b->data;
          uVar15 = 0;
          do {
            if (0 < (int)uVar7) {
              uVar19 = 0;
              pvVar18 = pvVar9;
              do {
                fVar22 = 0.0;
                if (0 < (int)uVar8) {
                  uVar20 = 0;
                  do {
                    fVar22 = fVar22 + *(float *)((long)pvVar18 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar16 != uVar20);
                }
                *(float *)((long)pvVar12 + uVar19 * 4 + (long)iVar21 * sVar2 * uVar15) = fVar22;
                uVar19 = uVar19 + 1;
                pvVar18 = (void *)((long)pvVar18 + lVar10 * 4);
              } while (uVar19 != uVar14);
            }
            uVar15 = uVar15 + 1;
            pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar3);
          } while (uVar15 != uVar11);
          return 0;
        }
        return 0;
      }
      if ((!bVar17 && !reduce_h) && reduce_c) {
        Mat::create(b,uVar7,sVar1,opt->blob_allocator);
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        Mat::create(&local_78,1,uVar7,uVar6,sVar1,opt->workspace_allocator);
        pvVar9 = local_78.data;
        iVar21 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_002043fd;
        uVar13 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar13) {
          memset(local_78.data,0,(ulong)uVar13 << 2);
        }
        if (0 < (int)uVar6) {
          sVar1 = a->cstep;
          sVar2 = a->elemsize;
          pvVar12 = a->data;
          uVar15 = 0;
          do {
            if (0 < (int)uVar7) {
              uVar19 = 0;
              pvVar18 = pvVar12;
              do {
                fVar22 = 0.0;
                if (0 < (int)uVar8) {
                  uVar20 = 0;
                  do {
                    fVar22 = fVar22 + *(float *)((long)pvVar18 + uVar20 * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar16 != uVar20);
                }
                *(float *)((long)pvVar9 +
                          uVar19 * 4 +
                          local_78.cstep *
                          CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * uVar15)
                     = fVar22;
                uVar19 = uVar19 + 1;
                pvVar18 = (void *)((long)pvVar18 + lVar10 * 4);
              } while (uVar19 != uVar14);
            }
            uVar15 = uVar15 + 1;
            pvVar12 = (void *)((long)pvVar12 + sVar1 * sVar2);
          } while (uVar15 != uVar11);
        }
        uVar8 = b->c * (int)b->cstep;
        if (0 < (int)uVar8) {
          memset(b->data,0,(ulong)uVar8 << 2);
        }
        if (0 < (int)uVar6) {
          pvVar9 = b->data;
          uVar16 = 0;
          pvVar12 = local_78.data;
          do {
            if (0 < (int)uVar7) {
              uVar15 = 0;
              do {
                *(float *)((long)pvVar9 + uVar15 * 4) =
                     *(float *)((long)pvVar12 + uVar15 * 4) + *(float *)((long)pvVar9 + uVar15 * 4);
                uVar15 = uVar15 + 1;
              } while (uVar14 != uVar15);
            }
            uVar16 = uVar16 + 1;
            pvVar12 = (void *)((long)pvVar12 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar16 != uVar11);
        }
      }
      else {
        if ((bVar5 || reduce_w) || !reduce_c) {
          if ((!reduce_w && !reduce_h) && reduce_c) {
            Mat::create(b,uVar8,uVar7,sVar1,opt->blob_allocator);
            uVar8 = b->c * (int)b->cstep;
            if (0 < (int)uVar8) {
              memset(b->data,0,(ulong)uVar8 << 2);
            }
            if (0 < (int)uVar6) {
              sVar1 = a->cstep;
              sVar2 = a->elemsize;
              pvVar9 = a->data;
              pvVar12 = b->data;
              uVar16 = 0;
              do {
                if (0 < (int)uVar13) {
                  uVar14 = 0;
                  do {
                    *(float *)((long)pvVar12 + uVar14 * 4) =
                         *(float *)((long)pvVar9 + uVar14 * 4) +
                         *(float *)((long)pvVar12 + uVar14 * 4);
                    uVar14 = uVar14 + 1;
                  } while (uVar13 != uVar14);
                }
                uVar16 = uVar16 + 1;
                pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar2);
              } while (uVar16 != uVar11);
              return 0;
            }
            return 0;
          }
          if ((bVar5 || reduce_w) || reduce_c) {
            return 0;
          }
          Mat::create(b,uVar8,uVar6,sVar1,opt->blob_allocator);
          uVar13 = b->c * (int)b->cstep;
          if (0 < (int)uVar13) {
            memset(b->data,0,(ulong)uVar13 << 2);
          }
          if (0 < (int)uVar6) {
            pvVar9 = a->data;
            sVar1 = a->cstep;
            pvVar12 = b->data;
            iVar21 = b->w;
            sVar2 = a->elemsize;
            sVar3 = b->elemsize;
            uVar14 = 0;
            do {
              if (0 < (int)uVar7) {
                uVar6 = 0;
                pvVar18 = pvVar9;
                do {
                  if (0 < (int)uVar8) {
                    uVar15 = 0;
                    do {
                      *(float *)((long)pvVar12 + uVar15 * 4) =
                           *(float *)((long)pvVar18 + uVar15 * 4) +
                           *(float *)((long)pvVar12 + uVar15 * 4);
                      uVar15 = uVar15 + 1;
                    } while (uVar16 != uVar15);
                  }
                  uVar6 = uVar6 + 1;
                  pvVar18 = (void *)((long)pvVar18 + lVar10 * 4);
                } while (uVar6 != uVar7);
              }
              uVar14 = uVar14 + 1;
              pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar2);
              pvVar12 = (void *)((long)pvVar12 + (long)iVar21 * sVar3);
            } while (uVar14 != uVar11);
            return 0;
          }
          return 0;
        }
        Mat::create(b,uVar8,sVar1,opt->blob_allocator);
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        Mat::create(&local_78,uVar8,1,uVar6,sVar1,opt->workspace_allocator);
        pvVar9 = local_78.data;
        iVar21 = -100;
        if ((local_78.data == (void *)0x0) || (local_78.cstep * (long)local_78.c == 0))
        goto LAB_002043fd;
        uVar13 = (int)local_78.cstep * local_78.c;
        if (0 < (int)uVar13) {
          memset(local_78.data,0,(ulong)uVar13 << 2);
        }
        if (0 < (int)uVar6) {
          pvVar12 = a->data;
          sVar1 = a->cstep;
          sVar2 = a->elemsize;
          uVar14 = 0;
          do {
            if (0 < (int)uVar7) {
              uVar13 = 0;
              pvVar18 = pvVar12;
              do {
                if (0 < (int)uVar8) {
                  uVar15 = 0;
                  do {
                    *(float *)((long)pvVar9 + uVar15 * 4) =
                         *(float *)((long)pvVar18 + uVar15 * 4) +
                         *(float *)((long)pvVar9 + uVar15 * 4);
                    uVar15 = uVar15 + 1;
                  } while (uVar16 != uVar15);
                }
                uVar13 = uVar13 + 1;
                pvVar18 = (void *)((long)pvVar18 + lVar10 * 4);
              } while (uVar13 != uVar7);
            }
            uVar14 = uVar14 + 1;
            pvVar12 = (void *)((long)pvVar12 + sVar1 * sVar2);
            pvVar9 = (void *)((long)pvVar9 +
                             local_78.cstep *
                             CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar14 != uVar11);
        }
        uVar7 = b->c * (int)b->cstep;
        if (0 < (int)uVar7) {
          memset(b->data,0,(ulong)uVar7 << 2);
        }
        if (0 < (int)uVar6) {
          pvVar9 = b->data;
          uVar14 = 0;
          pvVar12 = local_78.data;
          do {
            if (0 < (int)uVar8) {
              uVar15 = 0;
              do {
                *(float *)((long)pvVar9 + uVar15 * 4) =
                     *(float *)((long)pvVar12 + uVar15 * 4) + *(float *)((long)pvVar9 + uVar15 * 4);
                uVar15 = uVar15 + 1;
              } while (uVar16 != uVar15);
            }
            uVar14 = uVar14 + 1;
            pvVar12 = (void *)((long)pvVar12 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
          } while (uVar14 != uVar11);
        }
      }
      iVar21 = 0;
LAB_002043fd:
      Mat::~Mat(&local_78);
      return iVar21;
    }
    Mat::create(b,1,sVar1,opt->blob_allocator);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,uVar6,sVar1,opt->workspace_allocator);
    iVar21 = -100;
    if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
      if ((int)uVar6 < 1) {
LAB_002040a8:
        fVar22 = 0.0;
      }
      else {
        pvVar9 = a->data;
        sVar1 = a->cstep;
        sVar2 = a->elemsize;
        uVar16 = 0;
        do {
          fVar22 = 0.0;
          if (0 < (int)uVar13) {
            uVar14 = 0;
            do {
              fVar22 = fVar22 + *(float *)((long)pvVar9 + uVar14 * 4);
              uVar14 = uVar14 + 1;
            } while (uVar13 != uVar14);
          }
          *(float *)((long)local_78.data + uVar16 * 4) = fVar22;
          uVar16 = uVar16 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar1 * sVar2);
        } while (uVar16 != uVar11);
        if ((int)uVar6 < 1) goto LAB_002040a8;
        fVar22 = 0.0;
        uVar16 = 0;
        do {
          fVar22 = fVar22 + *(float *)((long)local_78.data + uVar16 * 4);
          uVar16 = uVar16 + 1;
        } while (uVar11 != uVar16);
      }
      *(float *)b->data = fVar22;
      iVar21 = 0;
    }
    piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar4 == (int *)0x0) {
      return iVar21;
    }
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 != 0) {
      return iVar21;
    }
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      return iVar21;
    }
    goto LAB_002040e6;
  }
  if (iVar21 != 2) {
    if (iVar21 == 1) {
      iVar21 = a->w;
      Mat::create(b,1,sVar1,opt->blob_allocator);
      if ((long)iVar21 < 1) {
        fVar22 = 0.0;
      }
      else {
        fVar22 = 0.0;
        lVar10 = 0;
        do {
          fVar22 = fVar22 + *(float *)((long)a->data + lVar10 * 4);
          lVar10 = lVar10 + 1;
        } while (iVar21 != lVar10);
      }
      *(float *)b->data = fVar22;
      return 0;
    }
    return 0;
  }
  uVar8 = a->w;
  uVar11 = (ulong)uVar8;
  uVar7 = a->h;
  uVar16 = (ulong)uVar7;
  if (!reduce_w || !reduce_h) {
    if (reduce_w && !reduce_h) {
      Mat::create(b,uVar7,sVar1,opt->blob_allocator);
      if (0 < (int)uVar7) {
        pvVar9 = a->data;
        iVar21 = a->w;
        sVar1 = a->elemsize;
        pvVar12 = b->data;
        uVar14 = 0;
        do {
          fVar22 = 0.0;
          if (0 < (int)uVar8) {
            uVar15 = 0;
            do {
              fVar22 = fVar22 + *(float *)((long)pvVar9 + uVar15 * 4);
              uVar15 = uVar15 + 1;
            } while (uVar11 != uVar15);
          }
          *(float *)((long)pvVar12 + uVar14 * 4) = fVar22;
          uVar14 = uVar14 + 1;
          pvVar9 = (void *)((long)pvVar9 + (long)iVar21 * sVar1);
        } while (uVar14 != uVar16);
        return 0;
      }
      return 0;
    }
    if (!reduce_h || reduce_w) {
      return 0;
    }
    Mat::create(b,uVar8,sVar1,opt->blob_allocator);
    uVar6 = b->c * (int)b->cstep;
    if (0 < (int)uVar6) {
      memset(b->data,0,(ulong)uVar6 << 2);
    }
    if (0 < (int)uVar7) {
      pvVar9 = a->data;
      iVar21 = a->w;
      sVar1 = a->elemsize;
      pvVar12 = b->data;
      uVar14 = 0;
      do {
        if (0 < (int)uVar8) {
          uVar15 = 0;
          do {
            *(float *)((long)pvVar12 + uVar15 * 4) =
                 *(float *)((long)pvVar9 + uVar15 * 4) + *(float *)((long)pvVar12 + uVar15 * 4);
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
        uVar14 = uVar14 + 1;
        pvVar9 = (void *)((long)pvVar9 + (long)iVar21 * sVar1);
      } while (uVar14 != uVar16);
      return 0;
    }
    return 0;
  }
  Mat::create(b,1,sVar1,opt->blob_allocator);
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78.elemsize._4_4_ = 0;
  local_78.elempack = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  Mat::create(&local_78,uVar7,sVar1,opt->workspace_allocator);
  iVar21 = -100;
  if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
    if ((int)uVar7 < 1) {
LAB_00204069:
      fVar22 = 0.0;
    }
    else {
      pvVar9 = a->data;
      iVar21 = a->w;
      sVar1 = a->elemsize;
      uVar14 = 0;
      do {
        fVar22 = 0.0;
        if (0 < (int)uVar8) {
          uVar15 = 0;
          do {
            fVar22 = fVar22 + *(float *)((long)pvVar9 + uVar15 * 4);
            uVar15 = uVar15 + 1;
          } while (uVar11 != uVar15);
        }
        *(float *)((long)local_78.data + uVar14 * 4) = fVar22;
        uVar14 = uVar14 + 1;
        pvVar9 = (void *)((long)pvVar9 + (long)iVar21 * sVar1);
      } while (uVar14 != uVar16);
      if ((int)uVar7 < 1) goto LAB_00204069;
      fVar22 = 0.0;
      uVar11 = 0;
      do {
        fVar22 = fVar22 + *(float *)((long)local_78.data + uVar11 * 4);
        uVar11 = uVar11 + 1;
      } while (uVar16 != uVar11);
    }
    *(float *)b->data = fVar22;
    iVar21 = 0;
  }
  piVar4 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar4 == (int *)0x0) {
    return iVar21;
  }
  LOCK();
  *piVar4 = *piVar4 + -1;
  UNLOCK();
  if (*piVar4 != 0) {
    return iVar21;
  }
  if (local_78.allocator != (Allocator *)0x0) {
    (*(local_78.allocator)->_vptr_Allocator[3])();
    return iVar21;
  }
LAB_002040e6:
  if (local_78.data != (void *)0x0) {
    free(local_78.data);
  }
  return iVar21;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);

            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}